

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2d29a37::MemPoolAccept::Workspace::Workspace
          (Workspace *this,CTransactionRef *ptx)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(this->m_conflicts)._M_t._M_impl.super__Rb_tree_header;
  (this->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header;
  (this->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_ancestors)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_package_feerate).nSatoshisPerK = 0;
  (this->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_entry)._M_t.super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
  ._M_t.super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
  super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl = (CTxMemPoolEntry *)0x0;
  this->m_sibling_eviction = false;
  this->m_ptx = ptx;
  this->m_hash = &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->hash;
  ValidationState<TxValidationResult>::ValidationState
            (&(this->m_state).super_ValidationState<TxValidationResult>);
  memset(&this->m_precomputed_txdata,0,0x102);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    *(undefined8 *)
     ((long)&(this->m_precomputed_txdata).m_spent_outputs.
             super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(this->m_precomputed_txdata).m_spent_outputs.
             super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 1) = 0;
    (this->m_precomputed_txdata).m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_precomputed_txdata).m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Workspace(const CTransactionRef& ptx) : m_ptx(ptx), m_hash(ptx->GetHash()) {}